

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O1

void __thiscall
FIX::SessionFactory::processFixtDataDictionaries
          (SessionFactory *this,SessionID *sessionID,Dictionary *settings,
          DataDictionaryProvider *provider)

{
  _Rb_tree_node_base *__rhs;
  _Base_ptr __n;
  Dictionary *settingsKey;
  int iVar1;
  long lVar2;
  _Base_ptr p_Var3;
  ConfigError *this_00;
  long *plVar4;
  size_type *psVar5;
  _func_int **pp_Var6;
  Dictionary *settings_00;
  Dictionary *settings_01;
  Dictionary *settings_02;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  bool bVar9;
  string beginStringQualifier;
  shared_ptr<FIX::DataDictionary> pDataDictionary;
  string frontKey;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  char local_190 [16];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  field_metrics local_160;
  DataDictionaryProvider *local_158;
  string local_150;
  _func_int **local_130;
  _func_int **local_128;
  SessionID *local_120;
  Dictionary *local_118;
  shared_ptr<FIX::DataDictionary> local_110;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0 [4];
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  _Base_ptr local_70;
  long local_68 [2];
  _Rb_tree_node_base *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_f0._0_8_ = local_e0;
  local_158 = provider;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"TransportDataDictionary","");
  createDataDictionary((SessionFactory *)local_100,(SessionID *)this,settings_00,(string *)settings)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0[0]._M_allocated_capacity + 1);
  }
  local_110.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_100._0_8_;
  local_110.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_100._8_8_ + 8) = *(_Atomic_word *)(local_100._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_100._8_8_ + 8) = *(_Atomic_word *)(local_100._8_8_ + 8) + 1;
    }
  }
  DataDictionaryProvider::addTransportDataDictionary(local_158,&sessionID->m_beginString,&local_110)
  ;
  local_120 = (SessionID *)this;
  if (local_110.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  p_Var3 = (settings->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(settings->m_data)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118 = settings;
  if (p_Var3 != local_58) {
    local_128 = (_func_int **)&PTR__FieldBase_001f8470;
    local_130 = (_func_int **)&PTR__FieldBase_001f8410;
    do {
      __rhs = p_Var3 + 1;
      std::__cxx11::string::substr((ulong)&local_78,(ulong)__rhs);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"AppDataDictionary","");
      string_toUpper((string *)local_f0,(string *)local_1b0);
      if (local_70 == (_Base_ptr)local_f0._8_8_) {
        if (local_70 == (_Base_ptr)0x0) {
          bVar9 = true;
        }
        else {
          iVar1 = bcmp(local_78,(void *)local_f0._0_8_,(size_t)local_70);
          bVar9 = iVar1 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._0_8_ != local_e0) {
        operator_delete((void *)local_f0._0_8_,local_e0[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
      }
      if (bVar9) {
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"AppDataDictionary","");
        string_toUpper((string *)local_f0,(string *)local_1b0);
        __n = p_Var3[1]._M_parent;
        if (__n == (_Base_ptr)local_f0._8_8_) {
          if (__n == (_Base_ptr)0x0) {
            bVar9 = true;
          }
          else {
            iVar1 = bcmp(*(void **)__rhs,(void *)local_f0._0_8_,(size_t)__n);
            bVar9 = iVar1 == 0;
          }
        }
        else {
          bVar9 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ != local_e0) {
          operator_delete((void *)local_f0._0_8_,local_e0[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._M_allocated_capacity + 1));
        }
        if (bVar9) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"DefaultApplVerID","");
          settingsKey = local_118;
          Dictionary::getString(&local_1d0,local_118,&local_150,false);
          local_1b0._0_8_ = local_128;
          local_1b0._8_4_ = 8;
          local_1a0._M_allocated_capacity = (size_type)local_190;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_1b0 + 0x10),local_1d0._M_dataplus._M_p,
                     local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
          local_180._M_p = (pointer)&local_170;
          local_178 = 0;
          local_170._M_local_buf[0] = '\0';
          local_160.m_length = 0;
          local_160.m_checksum = 0;
          local_1b0._0_8_ = local_130;
          Message::toApplVerID((ApplVerID *)local_f0,(BeginString *)local_1b0);
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AppDataDictionary","")
          ;
          createDataDictionary
                    ((SessionFactory *)&stack0xffffffffffffffc0,local_120,settings_01,
                     (string *)settingsKey);
          DataDictionaryProvider::addApplicationDataDictionary
                    (local_158,(ApplVerID *)local_f0,
                     (shared_ptr<FIX::DataDictionary> *)&stack0xffffffffffffffc0);
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_98[0] != local_88) {
            operator_delete(local_98[0],local_88[0] + 1);
          }
          FieldBase::~FieldBase((FieldBase *)local_f0);
          FieldBase::~FieldBase((FieldBase *)local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_150.field_2._M_allocated_capacity;
          _Var8._M_p = local_150._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
LAB_001b5a76:
            operator_delete(_Var8._M_p,uVar7 + 1);
          }
        }
        else {
          lVar2 = std::__cxx11::string::find((char)__rhs,0x2e);
          if (lVar2 == -1) {
            this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Malformed ","");
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
            local_1d0._M_dataplus._M_p = (pointer)*plVar4;
            psVar5 = (size_type *)(plVar4 + 2);
            if ((size_type *)local_1d0._M_dataplus._M_p == psVar5) {
              local_1d0.field_2._M_allocated_capacity = *psVar5;
              local_1d0.field_2._8_8_ = plVar4[3];
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar5;
            }
            local_1d0._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
            local_1b0._0_8_ = *plVar4;
            pp_Var6 = (_func_int **)(plVar4 + 2);
            if ((_func_int **)local_1b0._0_8_ == pp_Var6) {
              local_1a0._M_allocated_capacity = (size_type)*pp_Var6;
              local_1a0._8_8_ = plVar4[3];
              local_1b0._0_8_ = local_1b0 + 0x10;
            }
            else {
              local_1a0._M_allocated_capacity = (size_type)*pp_Var6;
            }
            local_1b0._8_8_ = plVar4[1];
            *plVar4 = (long)pp_Var6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __rhs);
            ConfigError::ConfigError(this_00,(string *)local_f0);
            __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          std::__cxx11::string::substr((ulong)&local_1d0,(ulong)__rhs);
          local_1b0._0_8_ = local_128;
          local_1b0._8_4_ = 8;
          local_1a0._M_allocated_capacity = (size_type)local_190;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_1b0 + 0x10),local_1d0._M_dataplus._M_p,
                     local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
          local_180._M_p = (pointer)&local_170;
          local_178 = 0;
          local_170._M_local_buf[0] = '\0';
          local_160.m_length = 0;
          local_160.m_checksum = 0;
          local_1b0._0_8_ = local_130;
          Message::toApplVerID((ApplVerID *)local_f0,(BeginString *)local_1b0);
          createDataDictionary
                    ((SessionFactory *)&stack0xffffffffffffffb0,local_120,settings_02,
                     (string *)local_118);
          DataDictionaryProvider::addApplicationDataDictionary
                    (local_158,(ApplVerID *)local_f0,
                     (shared_ptr<FIX::DataDictionary> *)&stack0xffffffffffffffb0);
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          FieldBase::~FieldBase((FieldBase *)local_f0);
          FieldBase::~FieldBase((FieldBase *)local_1b0);
          uVar7 = local_1d0.field_2._M_allocated_capacity;
          _Var8._M_p = local_1d0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001b5a76;
        }
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_58);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  return;
}

Assistant:

EXCEPT(ConfigError) {
  std::shared_ptr<DataDictionary> pDataDictionary
      = createDataDictionary(sessionID, settings, TRANSPORT_DATA_DICTIONARY);
  provider.addTransportDataDictionary(sessionID.getBeginString(), pDataDictionary);

  for (const Dictionary::value_type &data : settings) {
    const std::string &key = data.first;
    const std::string frontKey = key.substr(0, strlen(APP_DATA_DICTIONARY));
    if (frontKey == string_toUpper(APP_DATA_DICTIONARY)) {
      if (key == string_toUpper(APP_DATA_DICTIONARY)) {
        provider.addApplicationDataDictionary(
            Message::toApplVerID(settings.getString(DEFAULT_APPLVERID)),
            createDataDictionary(sessionID, settings, APP_DATA_DICTIONARY));
      } else {
        std::string::size_type offset = key.find('.');
        if (offset == std::string::npos) {
          throw ConfigError(std::string("Malformed ") + APP_DATA_DICTIONARY + ": " + key);
        }
        std::string beginStringQualifier = key.substr(offset + 1);
        provider.addApplicationDataDictionary(
            Message::toApplVerID(beginStringQualifier),
            createDataDictionary(sessionID, settings, key));
      }
    }
  }
}